

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc.c
# Opt level: O3

void do_aedit(CHAR_DATA *ch,char *argument)

{
  DESCRIPTOR_DATA *pDVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  AREA_DATA_conflict **ppAVar6;
  char arg [4608];
  char value2 [4608];
  char acStack_2428 [4608];
  char local_1228 [4616];
  
  bVar2 = check_security(ch);
  if (!bVar2) {
    return;
  }
  ppAVar6 = &ch->in_room->area->next;
  pcVar4 = one_argument(argument,acStack_2428);
  bVar2 = is_number(acStack_2428);
  if (bVar2) {
    iVar3 = atoi(acStack_2428);
    ppAVar6 = &area_first;
    do {
      ppAVar6 = &((AREA_DATA *)ppAVar6)->next->next;
      if ((AREA_DATA *)ppAVar6 == (AREA_DATA *)0x0) {
        pcVar4 = "That area vnum does not exist.\n\r";
        goto LAB_003547f9;
      }
    } while (((AREA_DATA *)ppAVar6)->vnum != iVar3);
  }
  else {
    bVar2 = str_cmp(acStack_2428,"create");
    if (!bVar2) {
      bVar2 = is_npc(ch);
      if ((bVar2) || (8 < ch->pcdata->security)) {
        one_argument(pcVar4,local_1228);
        iVar3 = atoi(local_1228);
        ppAVar6 = &area_first;
        do {
          ppAVar6 = &((AREA_DATA_conflict *)ppAVar6)->next->next;
          if ((AREA_DATA_conflict *)ppAVar6 == (AREA_DATA_conflict *)0x0) {
            ppAVar6 = &new_area()->next;
            area_last->next = (AREA_DATA_conflict *)ppAVar6;
            area_last = (AREA_DATA_conflict *)ppAVar6;
            *(byte *)((AREA_DATA *)ppAVar6)->area_flags =
                 (byte)((AREA_DATA *)ppAVar6)->area_flags[0] | 0x10;
            send_to_char("Area created.\n\r",ch);
            goto LAB_003547e6;
          }
        } while (((AREA_DATA_conflict *)ppAVar6)->vnum != iVar3);
        pcVar4 = "That area already exists!";
      }
      else {
        pcVar4 = "You do not have the access to create areas.\n\r";
      }
      goto LAB_003547f9;
    }
  }
LAB_003547e6:
  bVar2 = is_switched(ch);
  if (!bVar2) {
    if (((AREA_DATA *)ppAVar6)->security < ch->pcdata->security) {
LAB_00354848:
      pDVar1 = ch->desc;
      pDVar1->pEdit = ppAVar6;
      pDVar1->editor = 1;
      aedit_show(ch,"");
      return;
    }
    pcVar4 = ((AREA_DATA *)ppAVar6)->builders;
    pcVar5 = strstr(pcVar4,ch->name);
    if ((pcVar5 != (char *)0x0) || (pcVar4 = strstr(pcVar4,"All"), pcVar4 != (char *)0x0))
    goto LAB_00354848;
  }
  pcVar4 = "You have insufficent security to edit that area.\n\r";
LAB_003547f9:
  send_to_char(pcVar4,ch);
  return;
}

Assistant:

void do_aedit(CHAR_DATA *ch, char *argument)
{
	AREA_DATA *pArea;
	int value;
	char value2[MAX_STRING_LENGTH];
	char arg[MAX_STRING_LENGTH];

	if (!check_security(ch))
		return;

	pArea = ch->in_room->area;

	argument = one_argument(argument, arg);

	if (is_number(arg))
	{
		value = atoi(arg);
		if (!(pArea = get_area_data(value)))
		{
			send_to_char("That area vnum does not exist.\n\r", ch);
			return;
		}
	}
	else
	{
		if (!str_cmp(arg, "create"))
		{
			if (!is_npc(ch) && (ch->pcdata->security < 9))
			{
				send_to_char("You do not have the access to create areas.\n\r", ch);
				return;
			}

			argument = one_argument(argument, value2);
			value = atoi(value2);

			if (get_area_data(value) != nullptr)
			{
				send_to_char("That area already exists!", ch);
				return;
			}

			pArea = new_area();
			area_last->next = pArea;
			area_last = pArea; /* Thanks, Walker. */

			SET_BIT(pArea->area_flags, AREA_ADDED);

			send_to_char("Area created.\n\r", ch);
		}
	}

	if (!IS_BUILDER(ch, pArea))
	{
		send_to_char("You have insufficent security to edit that area.\n\r", ch);
		return;
	}

	ch->desc->pEdit = (void *)pArea;
	ch->desc->editor = ED_AREA;

	aedit_show(ch, "");
}